

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLIFilePartLoader.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::IFilePartLoader::~IFilePartLoader(IFilePartLoader *this)

{
  IFilePartLoader *in_RDI;
  
  (in_RDI->super_ExtraDataLoader)._vptr_ExtraDataLoader =
       (_func_int **)&PTR__IFilePartLoader_00db49a0;
  deleteFilePartLoader(in_RDI);
  if (in_RDI->mParserImpl != (IParserImpl *)0x0) {
    if (in_RDI->mParserImpl != (IParserImpl *)0x0) {
      (*in_RDI->mParserImpl->_vptr_IParserImpl[1])();
    }
    in_RDI->mParserImpl = (IParserImpl *)0x0;
  }
  ExtraDataLoader::~ExtraDataLoader(&in_RDI->super_ExtraDataLoader);
  return;
}

Assistant:

IFilePartLoader::~IFilePartLoader()
	{
		deleteFilePartLoader();
        if ( mParserImpl )
        {
            delete mParserImpl;
            mParserImpl = 0;
        }
	}